

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_context * ggml_init(ggml_init_params params)

{
  ulong uVar1;
  undefined8 uVar2;
  ggml_context *__dest;
  float fVar3;
  size_t mem_size;
  ggml_context *ctx;
  anon_union_2_2_620870ce u;
  int i;
  size_t in_stack_ffffffffffffff98;
  ulong local_50;
  ulong *size;
  undefined1 local_40 [6];
  int local_4;
  
  size = (ulong *)&stack0x00000008;
  ggml_critical_section_start();
  if ((ggml_init::is_first_call & 1U) != 0) {
    ggml_time_init();
    for (local_4 = 0; uVar2 = _local_40, local_4 < 0x10000; local_4 = local_4 + 1) {
      uVar1 = _local_40 >> 0x30;
      fVar3 = ggml_compute_fp16_to_fp32((ggml_fp16_t)uVar1);
      _local_40 = uVar2;
      ggml_table_f32_f16[local_4] = fVar3;
    }
    ggml_init::is_first_call = false;
  }
  ggml_critical_section_end();
  __dest = (ggml_context *)ggml_malloc(in_stack_ffffffffffffff98);
  if (*size == 0) {
    *size = 0x10;
  }
  if (size[1] == 0) {
    local_50 = *size + 0xf & 0xfffffffffffffff0;
  }
  else {
    local_50 = *size;
  }
  _local_40 = local_50;
  if (size[1] == 0) {
    ggml_aligned_malloc((size_t)size);
  }
  memcpy(__dest,local_40,0x28);
  if (__dest->mem_buffer == (void *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x5b3,"GGML_ASSERT(%s) failed","ctx->mem_buffer != NULL");
  }
  if (((ulong)__dest->mem_buffer & 0xf) != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x5b5,"GGML_ASSERT(%s) failed","((uintptr_t) (ctx->mem_buffer))%GGML_MEM_ALIGN == 0"
              );
  }
  return __dest;
}

Assistant:

struct ggml_context * ggml_init(struct ggml_init_params params) {
    static bool is_first_call = true;

    ggml_critical_section_start();

    if (is_first_call) {
        // initialize time system (required on Windows)
        ggml_time_init();

        for (int i = 0; i < (1 << 16); ++i) {
            union {
                uint16_t u16;
                ggml_fp16_t fp16;
            } u = {i};
            ggml_table_f32_f16[i] = GGML_COMPUTE_FP16_TO_FP32(u.fp16);
        }

        is_first_call = false;
    }

    ggml_critical_section_end();

    struct ggml_context * ctx = GGML_MALLOC(sizeof(struct ggml_context));

    // allow to call ggml_init with 0 size
    if (params.mem_size == 0) {
        params.mem_size = GGML_MEM_ALIGN;
    }

    const size_t mem_size = params.mem_buffer ? params.mem_size : GGML_PAD(params.mem_size, GGML_MEM_ALIGN);

    *ctx = (struct ggml_context) {
        /*.mem_size           =*/ mem_size,
        /*.mem_buffer         =*/ params.mem_buffer ? params.mem_buffer : ggml_aligned_malloc(mem_size),
        /*.mem_buffer_owned   =*/ params.mem_buffer ? false : true,
        /*.no_alloc           =*/ params.no_alloc,
        /*.n_objects          =*/ 0,
        /*.objects_begin      =*/ NULL,
        /*.objects_end        =*/ NULL,
    };

    GGML_ASSERT(ctx->mem_buffer != NULL);

    GGML_ASSERT_ALIGNED(ctx->mem_buffer);

    GGML_PRINT_DEBUG("%s: context initialized\n", __func__);

    return ctx;
}